

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::CreationErrorsTest::iterate(CreationErrorsTest *this)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  ulong in_RAX;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  ulong uVar6;
  uint uVar7;
  ErrorsUtilities *pEVar8;
  TestContext *this_00;
  GLuint texture;
  undefined8 uStack_28;
  long lVar5;
  
  uStack_28 = in_RAX;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar2) || (bVar3)) {
    uStack_28 = uStack_28 & 0xffffffff;
    pEVar8 = (ErrorsUtilities *)0x0;
    do {
      do {
        uVar7 = (int)pEVar8 + 1;
        pEVar8 = (ErrorsUtilities *)(ulong)uVar7;
      } while (uVar7 == 0xde0);
      uVar1 = 0;
      do {
        uVar6 = uVar1;
        if (uVar6 == 10) break;
        uVar1 = uVar6 + 1;
      } while (Textures::CreationTest::iterate::texture_targets[uVar6 + 1] != uVar7);
    } while (uVar6 < 10);
    (**(code **)(lVar5 + 0x400))(pEVar8,1,(long)&uStack_28 + 4);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x500,"glCreateTextures",
                       "target is not one of the allowable values.");
    if (uStack_28._4_4_ != 0) {
      (**(code **)(lVar5 + 0x480))(1,(long)&uStack_28 + 4);
      uStack_28 = uStack_28 & 0xffffffff;
    }
    pEVar8 = (ErrorsUtilities *)0xde1;
    (**(code **)(lVar5 + 0x400))(0xde1,0xffffffff,(long)&uStack_28 + 4);
    bVar3 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar8,(this->super_TestCase).m_context,0x501,"glCreateTextures",
                       "n is negative.");
    if (uStack_28._4_4_ != 0) {
      (**(code **)(lVar5 + 0x480))(1);
    }
    do {
      iVar4 = (**(code **)(lVar5 + 0x800))();
    } while (iVar4 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar2 && bVar3) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Textures' objects */
	glw::GLuint texture = 0;

	try
	{
		/* Not a target test. */
		gl.createTextures(NotATarget(), 1, &texture);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glCreateTextures",
								  "target is not one of the allowable values.");

		if (texture)
		{
			gl.deleteTextures(1, &texture);

			texture = 0;
		}

		/* Negative number of textures. */
		gl.createTextures(GL_TEXTURE_2D, -1, &texture);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glCreateTextures", "n is negative.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture)
	{
		gl.deleteTextures(1, &texture);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}